

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_reporter.h
# Opt level: O2

void __thiscall bandit::detail::info_reporter::it_starting(info_reporter *this,char *desc)

{
  int *piVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  string local_40;
  
  piVar1 = &(this->super_progress_reporter).specs_run_;
  *piVar1 = *piVar1 + 1;
  poVar2 = this->stm_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  pcVar3 = "\x1b[1;33m";
  pcVar4 = "";
  if (this->colorizer_->colors_enabled_ == false) {
    pcVar3 = "";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"[ TEST ]");
  if (this->colorizer_->colors_enabled_ != false) {
    pcVar4 = "\x1b[0m";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," it ");
  std::operator<<(poVar2,desc);
  std::__cxx11::string::~string((string *)&local_40);
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_starting(const char *desc)
	{
		progress_reporter::it_starting(desc);
		stm_
		  << indent()
		  << colorizer_.yellow()
		  << "[ TEST ]"
		  << colorizer_.reset()
		  << " it " << desc;
		++indentation_;
		stm_.flush();
	}